

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

wchar_t PDA::Transducer::Generator::registerSuffix(Register *source)

{
  Register *source_local;
  
  if ((source->integer & 1U) == 0) {
switchD_00167604_default:
    source_local._4_4_ = L'q';
  }
  else {
    switch(source->size) {
    case Full:
      source_local._4_4_ = L'q';
      break;
    case Half:
      source_local._4_4_ = L'l';
      break;
    case Quarter:
      source_local._4_4_ = L'w';
      break;
    case OneEight:
      source_local._4_4_ = L'b';
      break;
    default:
      goto switchD_00167604_default;
    }
  }
  return source_local._4_4_;
}

Assistant:

wchar_t Generator::registerSuffix(const Register &source)
{
    if (source.integer)
    {
        switch(source.size)
        {
        case Register::Size::Full:
            return L'q';
        case Register::Size::Half:
            return L'l';
        case Register::Size::Quarter:
            return L'w';
        case Register::Size::OneEight:
            return L'b';
        }
    }
    return L'q';
}